

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FieldGeneratorMap::FieldGeneratorMap
          (FieldGeneratorMap *this,Descriptor *descriptor,Options *options,
          MessageSCCAnalyzer *scc_analyzer)

{
  int iVar1;
  reference this_00;
  FieldDescriptor *field;
  FieldGenerator *__p;
  int local_40;
  int i;
  allocator<std::unique_ptr<google::protobuf::compiler::cpp::FieldGenerator,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>_>
  local_29;
  MessageSCCAnalyzer *local_28;
  MessageSCCAnalyzer *scc_analyzer_local;
  Options *options_local;
  Descriptor *descriptor_local;
  FieldGeneratorMap *this_local;
  
  this->descriptor_ = descriptor;
  local_28 = scc_analyzer;
  scc_analyzer_local = (MessageSCCAnalyzer *)options;
  options_local = (Options *)descriptor;
  descriptor_local = (Descriptor *)this;
  iVar1 = Descriptor::field_count(descriptor);
  std::
  allocator<std::unique_ptr<google::protobuf::compiler::cpp::FieldGenerator,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>_>
  ::allocator(&local_29);
  std::
  vector<std::unique_ptr<google::protobuf::compiler::cpp::FieldGenerator,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::FieldGenerator,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>_>_>
  ::vector(&this->field_generators_,(long)iVar1,&local_29);
  std::
  allocator<std::unique_ptr<google::protobuf::compiler::cpp::FieldGenerator,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>_>
  ::~allocator(&local_29);
  local_40 = 0;
  while( true ) {
    iVar1 = Descriptor::field_count((Descriptor *)options_local);
    if (iVar1 <= local_40) break;
    this_00 = std::
              vector<std::unique_ptr<google::protobuf::compiler::cpp::FieldGenerator,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::FieldGenerator,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>_>_>
              ::operator[](&this->field_generators_,(long)local_40);
    field = Descriptor::field((Descriptor *)options_local,local_40);
    __p = MakeGenerator(field,(Options *)scc_analyzer_local,local_28);
    std::
    unique_ptr<google::protobuf::compiler::cpp::FieldGenerator,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>
    ::reset(this_00,__p);
    local_40 = local_40 + 1;
  }
  return;
}

Assistant:

FieldGeneratorMap::FieldGeneratorMap(const Descriptor* descriptor,
                                     const Options& options,
                                     MessageSCCAnalyzer* scc_analyzer)
    : descriptor_(descriptor), field_generators_(descriptor->field_count()) {
  // Construct all the FieldGenerators.
  for (int i = 0; i < descriptor->field_count(); i++) {
    field_generators_[i].reset(
        MakeGenerator(descriptor->field(i), options, scc_analyzer));
  }
}